

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

wchar_t parse_device(dev_t *pdev,archive *a,char *val)

{
  char *pcVar1;
  pack_t_conflict *ppVar2;
  size_t sVar3;
  unsigned_long uVar4;
  dev_t dVar5;
  long lVar6;
  char *pcVar7;
  char *error;
  char *p;
  unsigned_long numbers [3];
  char *local_60;
  char *local_58;
  char *local_50;
  unsigned_long local_48 [3];
  
  local_60 = (char *)0x0;
  *pdev = 0;
  local_50 = val;
  pcVar1 = strchr(val,0x2c);
  if (pcVar1 == (char *)0x0) {
    dVar5 = mtree_atol(&local_50,L'\0');
LAB_002474c6:
    *pdev = dVar5;
    return L'\0';
  }
  *pcVar1 = '\0';
  ppVar2 = pack_find(val);
  if (ppVar2 == (pack_t_conflict *)0x0) {
    pcVar1 = "Unknown format `%s\'";
LAB_002474df:
    archive_set_error(a,0x54,pcVar1,val);
  }
  else {
    if (pcVar1[1] != '\0') {
      lVar6 = 0;
      pcVar1 = pcVar1 + 1;
      do {
        sVar3 = strcspn(pcVar1,",");
        pcVar7 = pcVar1 + sVar3;
        if (pcVar1[sVar3] != '\0') {
          *pcVar7 = '\0';
          pcVar7 = pcVar7 + 1;
        }
        local_58 = pcVar1;
        if (*pcVar1 == '\0') {
          pcVar1 = "Missing number";
          goto LAB_002474fd;
        }
        if (lVar6 == 3) {
          pcVar1 = "Too many arguments";
          goto LAB_002474fd;
        }
        uVar4 = mtree_atol(&local_58,L'\0');
        local_48[lVar6] = uVar4;
        lVar6 = lVar6 + 1;
        pcVar1 = pcVar7;
      } while (*pcVar7 != '\0');
      if (lVar6 != 1) {
        dVar5 = (*ppVar2)((int)lVar6,local_48,&local_60);
        if (local_60 == (char *)0x0) goto LAB_002474c6;
        pcVar1 = "%s";
        val = local_60;
        goto LAB_002474df;
      }
    }
    pcVar1 = "Not enough arguments";
LAB_002474fd:
    archive_set_error(a,0x54,pcVar1);
  }
  return L'\xffffffec';
}

Assistant:

static int
parse_device(dev_t *pdev, struct archive *a, char *val)
{
#define MAX_PACK_ARGS 3
	unsigned long numbers[MAX_PACK_ARGS];
	char *p, *dev;
	int argc;
	pack_t *pack;
	dev_t result;
	const char *error = NULL;

	memset(pdev, 0, sizeof(*pdev));
	if ((dev = strchr(val, ',')) != NULL) {
		/*
		 * Device's major/minor are given in a specified format.
		 * Decode and pack it accordingly.
		 */
		*dev++ = '\0';
		if ((pack = pack_find(val)) == NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown format `%s'", val);
			return ARCHIVE_WARN;
		}
		argc = 0;
		while ((p = la_strsep(&dev, ",")) != NULL) {
			if (*p == '\0') {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing number");
				return ARCHIVE_WARN;
			}
			if (argc >= MAX_PACK_ARGS) {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too many arguments");
				return ARCHIVE_WARN;
			}
			numbers[argc++] = (unsigned long)mtree_atol(&p, 0);
		}
		if (argc < 2) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Not enough arguments");
			return ARCHIVE_WARN;
		}
		result = (*pack)(argc, numbers, &error);
		if (error != NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "%s", error);
			return ARCHIVE_WARN;
		}
	} else {
		/* file system raw value. */
		result = (dev_t)mtree_atol(&val, 0);
	}
	*pdev = result;
	return ARCHIVE_OK;
#undef MAX_PACK_ARGS
}